

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O1

MicroProps * __thiscall
icu_63::number::impl::NumberFormatterImpl::preProcessUnsafe
          (NumberFormatterImpl *this,DecimalQuantity *inValue,UErrorCode *status)

{
  MicroPropsGenerator *pMVar1;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pMVar1 = this->fMicroPropsGenerator;
    if (pMVar1 == (MicroPropsGenerator *)0x0) {
      *status = U_INTERNAL_PROGRAM_ERROR;
    }
    else {
      (*pMVar1->_vptr_MicroPropsGenerator[2])(pMVar1,inValue,&this->fMicros,status);
      RoundingImpl::apply(&(this->fMicros).rounder,inValue,status);
      IntegerWidth::apply(&(this->fMicros).integerWidth,inValue,status);
    }
  }
  return &this->fMicros;
}

Assistant:

MicroProps& NumberFormatterImpl::preProcessUnsafe(DecimalQuantity& inValue, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return fMicros; // must always return a value
    }
    if (fMicroPropsGenerator == nullptr) {
        status = U_INTERNAL_PROGRAM_ERROR;
        return fMicros; // must always return a value
    }
    fMicroPropsGenerator->processQuantity(inValue, fMicros, status);
    fMicros.rounder.apply(inValue, status);
    fMicros.integerWidth.apply(inValue, status);
    return fMicros;
}